

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O3

void us_internal_free_loop_ssl_data(us_loop_t *loop)

{
  void *__ptr;
  
  __ptr = (loop->data).ssl_data;
  if (__ptr != (void *)0x0) {
    free(*(void **)((long)__ptr + 8));
    BIO_free(*(BIO **)((long)__ptr + 0x38));
    BIO_free(*(BIO **)((long)__ptr + 0x40));
    BIO_meth_free(*(undefined8 *)((long)__ptr + 0x48));
    free(__ptr);
    return;
  }
  return;
}

Assistant:

void us_internal_free_loop_ssl_data(struct us_loop_t *loop) {
    struct loop_ssl_data *loop_ssl_data = (struct loop_ssl_data *) loop->data.ssl_data;

    if (loop_ssl_data) {
        free(loop_ssl_data->ssl_read_output);

        BIO_free(loop_ssl_data->shared_rbio);
        BIO_free(loop_ssl_data->shared_wbio);

        BIO_meth_free(loop_ssl_data->shared_biom);

        free(loop_ssl_data);
    }
}